

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

Var Js::JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>
              (Var aValue,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  JavascriptTypedNumber<unsigned_long> *this_00;
  Var pvVar5;
  JavascriptString *value;
  JavascriptTypedNumber<long> *this_01;
  JavascriptDate *this_02;
  Type TVar6;
  ScriptContext *objectScriptContext;
  double value_00;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00a9d463;
    *puVar4 = 0;
  }
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00a9d463;
    *puVar4 = 0;
  }
  TVar6 = TypeIds_FirstNumberType;
  if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
     (TVar6 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00a9d463;
      *puVar4 = 0;
    }
    TVar6 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar6) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00a9d463:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  if ((int)TVar6 < 7) {
    if (TVar6 < TypeIds_Int64Number) {
      return aValue;
    }
    if (TVar6 == TypeIds_Int64Number) {
      this_01 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
      pvVar5 = JavascriptTypedNumber<long>::ToJavascriptNumber(this_01);
      return pvVar5;
    }
    if (TVar6 == TypeIds_LastNumberType) {
      this_00 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      pvVar5 = JavascriptTypedNumber<unsigned_long>::ToJavascriptNumber(this_00);
      return pvVar5;
    }
  }
  else if ((int)TVar6 < 0x22) {
    if (TVar6 - TypeIds_String < 3) {
      return aValue;
    }
  }
  else if ((int)TVar6 < 0x27) {
    if (TVar6 == TypeIds_Date) {
      this_02 = UnsafeVarTo<Js::JavascriptDate>(aValue);
      if (((((((((this_02->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary)
              .ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->optimizationOverrides).
           sideEffects & SideEffects_ValueOf) == SideEffects_None) {
        value_00 = DateImplementation::GetMilliSeconds(&this_02->m_date);
        pvVar5 = JavascriptNumber::ToVarNoCheck(value_00,requestContext);
        return pvVar5;
      }
      goto LAB_00a9d449;
    }
    if (TVar6 == TypeIds_NumberObject) {
      this_02 = (JavascriptDate *)UnsafeVarTo<Js::JavascriptNumberObject>(aValue);
      objectScriptContext =
           (((((this_02->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
            ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (((objectScriptContext->optimizationOverrides).sideEffects & SideEffects_ValueOf) ==
          SideEffects_None) {
        value = (JavascriptString *)
                JavascriptNumberObject::Unwrap((JavascriptNumberObject *)this_02);
        goto LAB_00a9d406;
      }
      goto LAB_00a9d449;
    }
  }
  else {
    if (TVar6 == TypeIds_SymbolObject) {
      this_02 = (JavascriptDate *)UnsafeVarTo<Js::JavascriptSymbolObject>(aValue);
      objectScriptContext =
           (((((this_02->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
            ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (((objectScriptContext->optimizationOverrides).sideEffects & SideEffects_ToPrimitive) ==
          SideEffects_None) {
        value = (JavascriptString *)
                JavascriptSymbolObject::Unwrap((JavascriptSymbolObject *)this_02);
LAB_00a9d406:
        pvVar5 = CrossSite::MarshalVar(requestContext,value,objectScriptContext);
        return pvVar5;
      }
      goto LAB_00a9d449;
    }
    if (TVar6 == TypeIds_StringObject) {
      this_02 = (JavascriptDate *)UnsafeVarTo<Js::JavascriptStringObject>(aValue);
      objectScriptContext =
           (((((this_02->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
            ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (((objectScriptContext->optimizationOverrides).sideEffects & SideEffects_ValueOf) ==
          SideEffects_None) {
        value = JavascriptStringObject::InternalUnwrap((JavascriptStringObject *)this_02);
        goto LAB_00a9d406;
      }
      goto LAB_00a9d449;
    }
  }
  this_02 = (JavascriptDate *)UnsafeVarTo<Js::RecyclableObject>(aValue);
LAB_00a9d449:
  pvVar5 = MethodCallToPrimitive<(Js::JavascriptHint)2>((RecyclableObject *)this_02,requestContext);
  return pvVar5;
}

Assistant:

Var JavascriptConversion::ToPrimitive(_In_ Var aValue, _In_ ScriptContext * requestContext)
    {
        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Undefined:
        case TypeIds_Null:
        case TypeIds_Integer:
        case TypeIds_Boolean:
        case TypeIds_Number:
        case TypeIds_String:
        case TypeIds_Symbol:
        case TypeIds_BigInt:
            return aValue;

        case TypeIds_StringObject:
            {
                JavascriptStringObject * stringObject = UnsafeVarTo<JavascriptStringObject>(aValue);
                ScriptContext * objectScriptContext = stringObject->GetScriptContext();
                if (objectScriptContext->optimizationOverrides.GetSideEffects() & (hint == JavascriptHint::HintString ? SideEffects_ToString : SideEffects_ValueOf))
                {
                    return MethodCallToPrimitive<hint>(stringObject, requestContext);
                }

                return CrossSite::MarshalVar(requestContext, stringObject->Unwrap(), objectScriptContext);
            }

        case TypeIds_NumberObject:
            {
                JavascriptNumberObject * numberObject = UnsafeVarTo<JavascriptNumberObject>(aValue);
                ScriptContext * objectScriptContext = numberObject->GetScriptContext();
                if (hint == JavascriptHint::HintString)
                {
                    if (objectScriptContext->optimizationOverrides.GetSideEffects() & SideEffects_ToString)
                    {
                        return MethodCallToPrimitive<hint>(numberObject, requestContext);
                    }
                    return JavascriptNumber::ToStringRadix10(numberObject->GetValue(), requestContext);
                }
                else
                {
                    if (objectScriptContext->optimizationOverrides.GetSideEffects() & SideEffects_ValueOf)
                    {
                        return MethodCallToPrimitive<hint>(numberObject, requestContext);
                    }

                    return CrossSite::MarshalVar(requestContext, numberObject->Unwrap(), objectScriptContext);
                }
            }


        case TypeIds_SymbolObject:
            {
                JavascriptSymbolObject* symbolObject = UnsafeVarTo<JavascriptSymbolObject>(aValue);
                ScriptContext* objectScriptContext = symbolObject->GetScriptContext();
                if (objectScriptContext->optimizationOverrides.GetSideEffects() & SideEffects_ToPrimitive)
                {
                    return MethodCallToPrimitive<hint>(symbolObject, requestContext);
                }

                return CrossSite::MarshalVar(requestContext, symbolObject->Unwrap(), objectScriptContext);
            }

        case TypeIds_Date:
            {
                JavascriptDate* dateObject = UnsafeVarTo<JavascriptDate>(aValue);
                if(hint == JavascriptHint::HintNumber)
                {
                    if (dateObject->GetScriptContext()->optimizationOverrides.GetSideEffects() & SideEffects_ValueOf)
                    {
                        // if no Method exists this function falls back to OrdinaryToPrimitive
                        // if IsES6ToPrimitiveEnabled flag is off we also fall back to OrdinaryToPrimitive
                        return MethodCallToPrimitive<hint>(dateObject, requestContext);
                    }
                    return JavascriptNumber::ToVarNoCheck(dateObject->GetTime(), requestContext);
                }
                else
                {
                    if (dateObject->GetScriptContext()->optimizationOverrides.GetSideEffects() & SideEffects_ToString)
                    {
                        // if no Method exists this function falls back to OrdinaryToPrimitive
                        // if IsES6ToPrimitiveEnabled flag is off we also fall back to OrdinaryToPrimitive
                        return MethodCallToPrimitive<hint>(dateObject, requestContext);
                    }
                    return JavascriptDate::ToString(dateObject, requestContext);
                }
            }

        // convert to JavascriptNumber
        case TypeIds_Int64Number:
            return UnsafeVarTo<JavascriptInt64Number>(aValue)->ToJavascriptNumber();
        case TypeIds_UInt64Number:
            return UnsafeVarTo<JavascriptUInt64Number>(aValue)->ToJavascriptNumber();

        default:
            // if no Method exists this function falls back to OrdinaryToPrimitive
            // if IsES6ToPrimitiveEnabled flag is off we also fall back to OrdinaryToPrimitive
            return MethodCallToPrimitive<hint>(UnsafeVarTo<RecyclableObject>(aValue), requestContext);
        }
    }